

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O2

int Ivy_CutReadLeaf(Ivy_Obj_t *pFanin)

{
  int iVar1;
  
  if (((ulong)pFanin & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pFanin)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                  ,0x3ef,"int Ivy_CutReadLeaf(Ivy_Obj_t *)");
  }
  if ((*(uint *)&pFanin->field_0x8 & 0xf) == 4) {
    iVar1 = Ivy_CutReadLeaf((Ivy_Obj_t *)((ulong)pFanin->pFanin0 & 0xfffffffffffffffe));
    if ((char)iVar1 == -1) {
      __assert_fail("nLats < IVY_LEAF_MASK",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                    ,0x3f4,"int Ivy_CutReadLeaf(Ivy_Obj_t *)");
    }
    iVar1 = iVar1 + 1;
  }
  else {
    iVar1 = pFanin->Id << 8;
  }
  return iVar1;
}

Assistant:

static inline int Ivy_CutReadLeaf( Ivy_Obj_t * pFanin )
{
    int nLats, iLeaf;
    assert( !Ivy_IsComplement(pFanin) );
    if ( !Ivy_ObjIsLatch(pFanin) )
        return Ivy_LeafCreate( pFanin->Id, 0 );
    iLeaf = Ivy_CutReadLeaf(Ivy_ObjFanin0(pFanin));
    nLats = Ivy_LeafLat(iLeaf);
    assert( nLats < IVY_LEAF_MASK );
    return 1 + iLeaf;
}